

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSSpStructMatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Clone
          (TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *this
          )

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x130);
  *(undefined ***)this_00 = &PTR__TPZSavable_019ea448;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19ea2e0;
  *(undefined8 *)this_00 = 0x19ea3a8;
  *(undefined4 *)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  *(undefined1 *)((long)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019e9bf8,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x19e9cd0;
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19e9db0;
  TPZStructMatrixOT<std::complex<double>_>::TPZStructMatrixOT
            ((TPZStructMatrixOT<std::complex<double>_> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019e9c20,
             (TPZStructMatrixOT<std::complex<double>_> *)
             &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.field_0xa0
            );
  *(undefined8 *)this_00 = 0x19e99a0;
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19e9b78;
  *(undefined8 *)&this_00->field_0xa0 = 0x19e9a70;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZSSpStructMatrix(*this);
}